

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  Options *options;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  Options *options_00;
  Options *extraout_RDX;
  int i;
  ulong uVar5;
  int i_2;
  string local_150;
  NamespaceOpener ns;
  Formatter format;
  CrossFileReferences refs;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  refs.weak_default_instances._M_h._M_buckets = &refs.weak_default_instances._M_h._M_single_bucket;
  options_00 = (Options *)0x1;
  refs.weak_default_instances._M_h._M_bucket_count = 1;
  refs.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_default_instances._M_h._M_element_count = 0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.strong_reflection_files._M_h._M_buckets = &refs.strong_reflection_files._M_h._M_single_bucket
  ;
  refs.strong_reflection_files._M_h._M_bucket_count = 1;
  refs.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.strong_reflection_files._M_h._M_element_count = 0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.weak_reflection_files._M_h._M_buckets = &refs.weak_reflection_files._M_h._M_single_bucket;
  refs.weak_reflection_files._M_h._M_bucket_count = 1;
  refs.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_reflection_files._M_h._M_element_count = 0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GetCrossFileReferencesForFile(this,this->file_,&refs);
  GenerateInternalForwardDeclarations(this,&refs,printer);
  options = &this->options_;
  Namespace_abi_cxx11_(&local_150,(cpp *)this->file_,(FileDescriptor *)options,options_00);
  NamespaceOpener::NamespaceOpener(&ns,&local_150,&format);
  std::__cxx11::string::~string((string *)&local_150);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    GenerateSourceDefaultInstance(this,(int)uVar5,printer);
  }
  NamespaceOpener::~NamespaceOpener(&ns);
  GenerateTables(this,printer);
  bVar4 = HasDescriptorMethods(this->file_,options);
  if (bVar4) {
    GenerateReflectionInitializationCode(this,printer);
  }
  Namespace_abi_cxx11_(&local_150,(cpp *)this->file_,(FileDescriptor *)options,options_00);
  NamespaceOpener::NamespaceOpener(&ns,&local_150,&format);
  std::__cxx11::string::~string((string *)&local_150);
  for (uVar5 = 0;
      puVar1 = (this->enum_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->enum_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar5 = uVar5 + 1) {
    EnumGenerator::GenerateMethods
              ((EnumGenerator *)
               puVar1[uVar5]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
               ._M_t,(int)uVar5,printer);
  }
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    Formatter::operator()<>(&format,"\n");
    Formatter::operator()<>
              (&format,"// ===================================================================\n");
    Formatter::operator()<>(&format,"\n");
    MessageGenerator::GenerateClassMethods
              ((MessageGenerator *)
               (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ._M_t,printer);
  }
  bVar4 = HasGenericServices(this->file_,options);
  if (bVar4) {
    for (uVar5 = 0;
        uVar5 < (ulong)((long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      if (uVar5 == 0) {
        Formatter::operator()<>(&format,"\n");
      }
      Formatter::operator()<>
                (&format,"// ===================================================================\n")
      ;
      Formatter::operator()<>(&format,"\n");
      ServiceGenerator::GenerateImplementation
                ((ServiceGenerator *)
                 (this->service_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                 ._M_t,printer);
    }
  }
  for (uVar5 = 0;
      puVar2 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->extension_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      uVar5 = uVar5 + 1) {
    ExtensionGenerator::GenerateDefinition
              ((ExtensionGenerator *)
               puVar2[uVar5]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ._M_t,printer);
  }
  Formatter::operator()<>(&format,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener(&ns);
  ProtobufNamespace_abi_cxx11_(&local_150,(cpp *)options,extraout_RDX);
  NamespaceOpener::NamespaceOpener(&ns,&local_150,&format);
  std::__cxx11::string::~string((string *)&local_150);
  for (uVar5 = 0;
      puVar3 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
      uVar5 = uVar5 + 1) {
    MessageGenerator::GenerateSourceInProto2Namespace
              ((MessageGenerator *)
               puVar3[uVar5]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ._M_t,printer);
  }
  NamespaceOpener::~NamespaceOpener(&ns);
  Formatter::operator()<>(&format,"\n// @@protoc_insertion_point(global_scope)\n");
  std::__cxx11::string::string
            ((string *)&ns,"net/proto2/public/port_undef.inc",(allocator *)&local_150);
  IncludeFile(this,(string *)&ns,printer);
  std::__cxx11::string::~string((string *)&ns);
  CrossFileReferences::~CrossFileReferences(&refs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  GenerateInternalForwardDeclarations(refs, printer);

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    for (int i = 0; i < message_generators_.size(); i++) {
      GenerateSourceDefaultInstance(i, printer);
    }
  }

  {
    GenerateTables(printer);

    if (HasDescriptorMethods(file_, options_)) {
      // Define the code to initialize reflection. This code uses a global
      // constructor to register reflection data with the runtime pre-main.
      GenerateReflectionInitializationCode(printer);
    }
  }

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Actually implement the protos

    // Generate enums.
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateMethods(i, printer);
    }

    // Generate classes.
    for (int i = 0; i < message_generators_.size(); i++) {
      format("\n");
      format(kThickSeparator);
      format("\n");
      message_generators_[i]->GenerateClassMethods(printer);
    }

    if (HasGenericServices(file_, options_)) {
      // Generate services.
      for (int i = 0; i < service_generators_.size(); i++) {
        if (i == 0) format("\n");
        format(kThickSeparator);
        format("\n");
        service_generators_[i]->GenerateImplementation(printer);
      }
    }

    // Define extensions.
    for (int i = 0; i < extension_generators_.size(); i++) {
      extension_generators_[i]->GenerateDefinition(printer);
    }

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateSourceInProto2Namespace(printer);
    }
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");

  IncludeFile("net/proto2/public/port_undef.inc", printer);
}